

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxClone.cpp
# Opt level: O0

int slang::syntax::deep::clone(__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  NamedLabelSyntax *args_4;
  ImmediateAssertionStatementSyntax *pIVar1;
  Token TVar2;
  BumpAllocator *in_stack_00000038;
  SyntaxList<slang::syntax::AttributeInstanceSyntax> *in_stack_00000040;
  BumpAllocator *in_stack_000000d8;
  Token *in_stack_000000e0;
  BumpAllocator *in_stack_ffffffffffffff88;
  DeferredAssertionSyntax *in_stack_ffffffffffffff90;
  DeferredAssertionSyntax *local_58;
  ParenthesizedExpressionSyntax *pPVar3;
  ActionBlockSyntax *pAVar4;
  
  pPVar3 = (ParenthesizedExpressionSyntax *)__child_stack;
  pAVar4 = (ActionBlockSyntax *)__fn;
  if (*(long *)(__fn + 0x18) == 0) {
    args_4 = (NamedLabelSyntax *)0x0;
  }
  else {
    args_4 = deepClone<slang::syntax::NamedLabelSyntax>
                       ((NamedLabelSyntax *)in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  }
  deepClone<slang::syntax::AttributeInstanceSyntax>(in_stack_00000040,in_stack_00000038);
  TVar2 = parsing::Token::deepClone(in_stack_000000e0,in_stack_000000d8);
  if (pAVar4[2].statement == (StatementSyntax *)0x0) {
    local_58 = (DeferredAssertionSyntax *)0x0;
  }
  else {
    local_58 = deepClone<slang::syntax::DeferredAssertionSyntax>
                         (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  }
  not_null<slang::syntax::ParenthesizedExpressionSyntax_*>::operator*
            ((not_null<slang::syntax::ParenthesizedExpressionSyntax_*> *)0x81bd97);
  deepClone<slang::syntax::ParenthesizedExpressionSyntax>
            ((ParenthesizedExpressionSyntax *)in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  not_null<slang::syntax::ActionBlockSyntax_*>::operator*
            ((not_null<slang::syntax::ActionBlockSyntax_*> *)0x81bdb7);
  deepClone<slang::syntax::ActionBlockSyntax>
            ((ActionBlockSyntax *)in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  pIVar1 = BumpAllocator::
           emplace<slang::syntax::ImmediateAssertionStatementSyntax,slang::syntax::SyntaxKind_const&,slang::syntax::NamedLabelSyntax*,slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>&,slang::parsing::Token,slang::syntax::DeferredAssertionSyntax*,slang::syntax::ParenthesizedExpressionSyntax&,slang::syntax::ActionBlockSyntax&>
                     ((BumpAllocator *)TVar2.info,TVar2._0_8_,(NamedLabelSyntax **)local_58,
                      (SyntaxList<slang::syntax::AttributeInstanceSyntax> *)__fn,
                      (Token *)__child_stack,(DeferredAssertionSyntax **)args_4,pPVar3,pAVar4);
  return (int)pIVar1;
}

Assistant:

static SyntaxNode* clone(const ImmediateAssertionStatementSyntax& node, BumpAllocator& alloc) {
    return alloc.emplace<ImmediateAssertionStatementSyntax>(
        node.kind,
        node.label ? deepClone(*node.label, alloc) : nullptr,
        *deepClone(node.attributes, alloc),
        node.keyword.deepClone(alloc),
        node.delay ? deepClone(*node.delay, alloc) : nullptr,
        *deepClone<ParenthesizedExpressionSyntax>(*node.expr, alloc),
        *deepClone<ActionBlockSyntax>(*node.action, alloc)
    );
}